

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QDateTimeParser::SectionNode>::begin(QList<QDateTimeParser::SectionNode> *this)

{
  SectionNode *n;
  QArrayDataPointer<QDateTimeParser::SectionNode> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QDateTimeParser::SectionNode> *)0x564519);
  QArrayDataPointer<QDateTimeParser::SectionNode>::operator->(in_RDI);
  n = QArrayDataPointer<QDateTimeParser::SectionNode>::begin
                ((QArrayDataPointer<QDateTimeParser::SectionNode> *)0x56452a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }